

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O1

void __thiscall w3Interp::i32_Store8(w3Interp *this)

{
  pointer *ppwVar1;
  undefined1 uVar2;
  Value *pVVar3;
  undefined1 *puVar4;
  
  pVVar3 = w3Stack::value(&this->super_w3Stack,Tag_i32);
  uVar2 = *(undefined1 *)pVVar3;
  w3Stack::AssertTopIsValue(&this->super_w3Stack);
  ppwVar1 = &(this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
             super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppwVar1 = *ppwVar1 + -1;
  puVar4 = (undefined1 *)LoadStore(this,1);
  *puVar4 = uVar2;
  return;
}

Assistant:

INTERP (i32_Store8)
{
    const uint32_t a = pop_u32 ();
    *(uint8_t*)LoadStore (1) = (uint8_t)(a & 0xFF);
}